

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_conjunctive.cpp
# Opt level: O0

void __thiscall ColValCondDAGNode::~ColValCondDAGNode(ColValCondDAGNode *this)

{
  ColValCondDAGNode *this_local;
  
  std::__cxx11::string::~string((string *)&this->left_col_name_);
  CondDAGNode::~CondDAGNode(&this->super_CondDAGNode);
  return;
}

Assistant:

~ColValCondDAGNode() final {
    }